

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Result * __thiscall
Catch::clara::detail::Parser::validate(Result *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pOVar2;
  pointer pcVar3;
  pointer pAVar4;
  pointer pOVar5;
  pointer pAVar6;
  bool bVar7;
  
  pOVar5 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = pOVar5 == pOVar2;
  if (!bVar7) {
    (*(pOVar5->super_ParserRefImpl<Catch::clara::detail::Opt>).
      super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__,pOVar5);
    if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok) {
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      do {
        pOVar5 = pOVar5 + 1;
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
             (_func_int **)&PTR__BasicResult_001985c8;
        pcVar3 = (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        bVar7 = pOVar5 == pOVar2;
        if (bVar7) goto LAB_0014c423;
        (*(pOVar5->super_ParserRefImpl<Catch::clara::detail::Opt>).
          super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2]
        )(__return_storage_ptr__,pOVar5);
      } while ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok);
    }
    if (!bVar7) {
      return __return_storage_ptr__;
    }
  }
LAB_0014c423:
  pAVar6 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = pAVar6 == pAVar4;
  if (!bVar7) {
    (*(pAVar6->super_ParserRefImpl<Catch::clara::detail::Arg>).
      super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__,pAVar6);
    if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok) {
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      do {
        pAVar6 = pAVar6 + 1;
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
             (_func_int **)&PTR__BasicResult_001985c8;
        pcVar3 = (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        bVar7 = pAVar6 == pAVar4;
        if (bVar7) goto LAB_0014c491;
        (*(pAVar6->super_ParserRefImpl<Catch::clara::detail::Arg>).
          super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2]
        )(__return_storage_ptr__,pAVar6);
      } while ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok);
    }
    if (!bVar7) {
      return __return_storage_ptr__;
    }
  }
LAB_0014c491:
  (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001985c8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            for( auto const &opt : m_options ) {
                auto result = opt.validate();
                if( !result )
                    return result;
            }
            for( auto const &arg : m_args ) {
                auto result = arg.validate();
                if( !result )
                    return result;
            }
            return Result::ok();
        }